

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currencies_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::subject::CurrenciesTest_test_base_currencies_are_valid_Test::TestBody
          (CurrenciesTest_test_base_currencies_are_valid_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  internal iVar3;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertHelper local_70;
  string local_68;
  internal local_48 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38 [2];
  long local_28 [2];
  
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"EUR","");
  local_38[0].ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"EURGBP","");
  local_48[0] = (internal)
                bidfx_public_api::price::Currencies::IsValidCurrencyAndPair
                          ((string *)&local_68,(string *)local_38);
  local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_38[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28) {
    operator_delete(local_38[0].ptr_,local_28[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  iVar3 = local_48[0];
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,local_48,
               (AssertionResult *)"Currencies::IsValidCurrencyAndPair(\"EUR\", \"EURGBP\")","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
               ,0xe9,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (local_38[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_38[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38[0].ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (iVar3 != (internal)0x0) {
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"EUR","");
    local_38[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"EURUSD","");
    local_48[0] = (internal)
                  bidfx_public_api::price::Currencies::IsValidCurrencyAndPair
                            ((string *)&local_68,(string *)local_38);
    local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_38[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28) {
      operator_delete(local_38[0].ptr_,local_28[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    iVar3 = local_48[0];
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_38);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_68,local_48,
                 (AssertionResult *)"Currencies::IsValidCurrencyAndPair(\"EUR\", \"EURUSD\")",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                 ,0xea,local_68._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)local_38);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if (local_38[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_38[0].ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_38[0].ptr_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (iVar3 != (internal)0x0) {
      local_68._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"GBP","");
      local_38[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"GBPAUD","");
      local_48[0] = (internal)
                    bidfx_public_api::price::Currencies::IsValidCurrencyAndPair
                              ((string *)&local_68,(string *)local_38);
      local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_38[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28) {
        operator_delete(local_38[0].ptr_,local_28[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      iVar3 = local_48[0];
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_38);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_68,local_48,
                   (AssertionResult *)"Currencies::IsValidCurrencyAndPair(\"GBP\", \"GBPAUD\")",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                   ,0xeb,local_68._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)local_38);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != paVar1) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        if (local_38[0].ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_38[0].ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_38[0].ptr_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (iVar3 != (internal)0x0) {
        local_68._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"XAU","");
        local_38[0].ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"XAUUSD","");
        iVar3 = (internal)
                bidfx_public_api::price::Currencies::IsValidCurrencyAndPair
                          ((string *)&local_68,(string *)local_38);
        local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_48[0] = iVar3;
        if (local_38[0].ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28) {
          operator_delete(local_38[0].ptr_,local_28[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != paVar1) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        if (iVar3 == (internal)0x0) {
          testing::Message::Message((Message *)local_38);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_68,local_48,
                     (AssertionResult *)"Currencies::IsValidCurrencyAndPair(\"XAU\", \"XAUUSD\")",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_70,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/currencies_test.cpp"
                     ,0xec,local_68._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_70,(Message *)local_38);
          testing::internal::AssertHelper::~AssertHelper(&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != paVar1) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          if (local_38[0].ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (local_38[0].ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_38[0].ptr_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
  }
  return;
}

Assistant:

TEST(CurrenciesTest, test_empty_string_is_not_valid_currency_pair)
{
    ASSERT_FALSE(Currencies::IsValidCurrencyPair(""));
}